

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O1

void SUNMatDestroy_Sparse(SUNMatrix A)

{
  void *pvVar1;
  
  pvVar1 = *(void **)((long)A->content + 0x20);
  if (pvVar1 != (void *)0x0) {
    free(pvVar1);
    *(undefined8 *)((long)A->content + 0x20) = 0;
  }
  pvVar1 = *(void **)((long)A->content + 0x30);
  if (pvVar1 != (void *)0x0) {
    free(pvVar1);
    pvVar1 = A->content;
    *(undefined8 *)((long)pvVar1 + 0x30) = 0;
    *(undefined8 *)((long)pvVar1 + 0x40) = 0;
    *(undefined8 *)((long)pvVar1 + 0x50) = 0;
  }
  pvVar1 = *(void **)((long)A->content + 0x38);
  if (pvVar1 != (void *)0x0) {
    free(pvVar1);
    pvVar1 = A->content;
    *(undefined8 *)((long)pvVar1 + 0x38) = 0;
    *(undefined8 *)((long)pvVar1 + 0x48) = 0;
    *(undefined8 *)((long)pvVar1 + 0x58) = 0;
  }
  free(A->content);
  A->content = (void *)0x0;
  free(A->ops);
  A->ops = (_generic_SUNMatrix_Ops *)0x0;
  free(A);
  return;
}

Assistant:

void SUNMatDestroy_Sparse(SUNMatrix A)
{
  /* perform operation */
  if (SM_DATA_S(A)) {
    free(SM_DATA_S(A));  SM_DATA_S(A) = NULL;
  }
  if (SM_INDEXVALS_S(A)) {
    free(SM_INDEXVALS_S(A));
    SM_INDEXVALS_S(A) = NULL;
    SM_CONTENT_S(A)->rowvals = NULL;
    SM_CONTENT_S(A)->colvals = NULL;
  }
  if (SM_INDEXPTRS_S(A)) {
    free(SM_INDEXPTRS_S(A));
    SM_INDEXPTRS_S(A) = NULL;
    SM_CONTENT_S(A)->colptrs = NULL;
    SM_CONTENT_S(A)->rowptrs = NULL;
  }
  free(A->content); A->content = NULL;
  free(A->ops);  A->ops = NULL;
  free(A); A = NULL;
  return;
}